

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_529705::LaneBasedExecutionQueue::executeProcess
          (LaneBasedExecutionQueue *this,QueueJobContext *opaqueContext,
          ArrayRef<llvm::StringRef> commandLine,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment,
          ProcessAttributes attributes,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn,
          ProcessDelegate *delegate)

{
  QueueJobContext *pQVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  code *pcVar2;
  _func_int **pp_Var3;
  ProcessContext *ctx;
  StringRef value;
  StringRef value_00;
  StringRef key;
  StringRef value_01;
  ArrayRef<llvm::StringRef> commandLine_00;
  code cVar4;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar5;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar6;
  char **ppcVar7;
  iterator __begin2;
  StringRef Separator;
  StringRef key_00;
  StringRef key_01;
  unique_lock<std::mutex> lock;
  ProcessCompletionFn laneCompletionFn;
  POSIXEnvironment posixEnv;
  SmallString<64U> description;
  undefined1 local_228 [8];
  bool bStack_220;
  undefined7 uStack_21f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  ProcessHandle local_1b0;
  QueueJobContext *local_1a8;
  QueueJobContext *local_1a0;
  StringRef *local_198;
  size_type local_190;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  POSIXEnvironment local_168;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [64];
  undefined1 local_a0 [56];
  size_type local_68;
  __node_base local_60;
  size_type local_58;
  _Prime_rehash_policy local_50;
  __node_base_ptr local_40;
  bool local_38;
  
  ppVar6 = environment.Data;
  local_190 = commandLine.Length;
  local_198 = commandLine.Data;
  local_f0 = local_e0;
  local_e8 = 0x4000000000;
  (**(code **)(*(long *)*opaqueContext[3]._vptr_QueueJobContext + 0x18))
            (*opaqueContext[3]._vptr_QueueJobContext,&local_f0);
  local_228 = (undefined1  [8])&this->readyJobsMutex;
  bStack_220 = false;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_228);
  bStack_220 = true;
  if (this->cancelled == true) {
    if ((completionFn->Storage).hasVal == true) {
      local_180 = 0;
      uStack_178 = 0;
      local_170 = 0;
      local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xffffffff00000002;
      local_168.envStorage.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)CONCAT44(uStack_184,0xffffffff);
      local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.envStorage.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (*(long *)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10)
          == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18))
                (completionFn,&local_168);
      if ((bStack_220 & 1U) == 0) goto LAB_001c0c85;
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_228);
  }
  else {
    pQVar1 = opaqueContext + 2;
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_228);
    local_168.keys._M_h._M_buckets = &local_168.keys._M_h._M_single_bucket;
    local_168.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_168.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_168.keys._M_h._M_element_count = 0;
    local_168.keys._M_h._M_bucket_count = 1;
    local_168.keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_168.keys._M_h._M_rehash_policy._4_4_ = 0;
    local_168.keys._M_h._M_rehash_policy._M_next_resize = 0;
    local_168.keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_168.isFrozen = false;
    local_1e8 = (code *)CONCAT62(local_1e8._2_6_,0x109);
    local_1f8._0_4_ = this->buildID;
    llvm::Twine::str_abi_cxx11_((string *)local_228,(Twine *)&local_1f8);
    value.Length._0_1_ = bStack_220;
    value.Data = (char *)local_228;
    value.Length._1_7_ = uStack_21f;
    key_00.Length = 0x10;
    key_00.Data = "LLBUILD_BUILD_ID";
    llbuild::basic::POSIXEnvironment::setIfMissing(&local_168,key_00,value);
    if (local_228 != (undefined1  [8])&local_218) {
      operator_delete((void *)local_228,(ulong)(local_218._M_allocated_capacity + 1));
    }
    local_1e8 = (code *)CONCAT62(local_1e8._2_6_,0x10b);
    local_1f8._M_unused._0_8_ = (undefined8)pQVar1;
    llvm::Twine::str_abi_cxx11_((string *)local_228,(Twine *)&local_1f8);
    value_00.Length._0_1_ = bStack_220;
    value_00.Data = (char *)local_228;
    value_00.Length._1_7_ = uStack_21f;
    key_01.Length = 0xf;
    key_01.Data = "LLBUILD_LANE_ID";
    llbuild::basic::POSIXEnvironment::setIfMissing(&local_168,key_01,value_00);
    if (local_228 != (undefined1  [8])&local_218) {
      operator_delete((void *)local_228,(ulong)(local_218._M_allocated_capacity + 1));
    }
    local_1a8 = pQVar1;
    local_1a0 = opaqueContext;
    if (environment.Length != 0) {
      ppVar5 = ppVar6 + environment.Length;
      do {
        llbuild::basic::POSIXEnvironment::setIfMissing(&local_168,ppVar6->first,ppVar6->second);
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != ppVar5);
    }
    if (attributes.inheritEnvironment != false) {
      ppcVar7 = this->environment;
      local_1f8._M_unused._0_8_ = (undefined8)*ppcVar7;
      if ((_func_void *)local_1f8._M_unused._0_8_ != (_func_void *)0x0) {
        do {
          ppcVar7 = ppcVar7 + 1;
          local_1f8._8_8_ = strlen((char *)local_1f8._M_unused._0_8_);
          local_1d8._M_pod_data[0] = 0x3d;
          Separator.Length = 1;
          Separator.Data = (char *)&local_1d8;
          llvm::StringRef::split
                    ((pair<llvm::StringRef,_llvm::StringRef> *)local_228,(StringRef *)&local_1f8,
                     Separator);
          key.Length._0_1_ = bStack_220;
          key.Data = (char *)local_228;
          key.Length._1_7_ = uStack_21f;
          value_01.Length = local_218._8_8_;
          value_01.Data = (char *)local_218._M_allocated_capacity;
          llbuild::basic::POSIXEnvironment::setIfMissing(&local_168,key,value_01);
          local_1f8._M_unused._M_object = *ppcVar7;
        } while ((_func_void *)local_1f8._M_unused._0_8_ != (_func_void *)0x0);
      }
    }
    pQVar1 = local_1a0;
    local_1b0.id = (uint64_t)local_1a0[1]._vptr_QueueJobContext;
    local_1f8._8_8_ = 0;
    local_1e0 = std::
                _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:434:34)>
                ::_M_invoke;
    local_1e8 = std::
                _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:434:34)>
                ::_M_manager;
    local_208 = (code)(completionFn->Storage).hasVal;
    local_1f8._M_unused._M_object = this;
    if (local_208 == (code)0x1) {
      local_218._M_allocated_capacity = 0;
      local_218._8_8_ = 0;
      local_228 = (undefined1  [8])0x0;
      bStack_220 = false;
      uStack_21f = 0;
      pcVar2 = *(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer +
                         0x10);
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)(local_228,completionFn,2);
        local_218._M_allocated_capacity =
             *(undefined8 *)
              ((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10);
        local_218._8_8_ =
             *(undefined8 *)
              ((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18);
      }
    }
    cVar4 = local_208;
    pp_Var3 = local_1a8->_vptr_QueueJobContext;
    local_1c8 = (code *)0x0;
    pcStack_1c0 = (code *)0x0;
    local_1d8._M_unused._M_object = (void *)0x0;
    local_1d8._8_8_ = 0;
    local_1d8._M_unused._M_object = operator_new(0x30);
    *(code *)(local_1d8._M_unused._M_member_pointer + 0x20) = cVar4;
    if (((byte)cVar4 & 1) != 0) {
      *(undefined8 *)local_1d8._M_unused._0_8_ = 0;
      *(undefined8 *)((long)local_1d8._M_unused._0_8_ + 8) = 0;
      *(undefined8 *)((long)local_1d8._M_unused._0_8_ + 0x10) = 0;
      *(undefined8 *)((long)local_1d8._M_unused._0_8_ + 0x18) = local_218._8_8_;
      if ((char *)local_218._M_allocated_capacity != (char *)0x0) {
        *(undefined1 (*) [8])local_1d8._M_unused._0_8_ = local_228;
        *(ulong *)((long)local_1d8._M_unused._0_8_ + 8) = CONCAT71(uStack_21f,bStack_220);
        *(size_type *)((long)local_1d8._M_unused._0_8_ + 0x10) = local_218._M_allocated_capacity;
        local_218._M_allocated_capacity = 0;
        local_218._8_8_ = 0;
      }
    }
    *(_func_int ***)((long)local_1d8._M_unused._0_8_ + 0x28) = pp_Var3;
    pcStack_1c0 = std::
                  _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:450:7)>
                  ::_M_invoke;
    local_1c8 = std::
                _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:450:7)>
                ::_M_manager;
    if (delegate == (ProcessDelegate *)0x0) {
      delegate = &((this->super_ExecutionQueue).delegate)->super_ProcessDelegate;
    }
    ctx = (ProcessContext *)*pQVar1[3]._vptr_QueueJobContext;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_a0,&local_168.env);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_a0 + 0x18),&local_168.envStorage);
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_a0 + 0x30);
    local_a0._48_8_ = (__buckets_ptr)0x0;
    local_68 = local_168.keys._M_h._M_bucket_count;
    local_60._M_nxt = (_Hash_node_base *)0x0;
    local_58 = local_168.keys._M_h._M_element_count;
    local_50._M_max_load_factor = local_168.keys._M_h._M_rehash_policy._M_max_load_factor;
    local_50._4_4_ = local_168.keys._M_h._M_rehash_policy._4_4_;
    local_50._M_next_resize = local_168.keys._M_h._M_rehash_policy._M_next_resize;
    local_40 = (__node_base_ptr)0x0;
    local_228 = (undefined1  [8])this_00;
    std::
    _Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<llvm::StringRef,true>>>>
              ((_Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this_00->_M_local_buf,&local_168.keys._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<llvm::StringRef,_true>_>_> *)
               local_228);
    local_38 = local_168.isFrozen;
    commandLine_00.Length = local_190;
    commandLine_00.Data = local_198;
    llbuild::basic::spawnProcess
              (delegate,ctx,&this->spawnedProcesses,local_1b0,commandLine_00,
               (POSIXEnvironment *)local_a0,attributes,(ProcessReleaseFn *)&local_1f8,
               (ProcessCompletionFn *)&local_1d8);
    std::
    _Hashtable<llvm::StringRef,_llvm::StringRef,_std::allocator<llvm::StringRef>,_std::__detail::_Identity,_std::equal_to<llvm::StringRef>,_std::hash<llvm::StringRef>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<llvm::StringRef,_llvm::StringRef,_std::allocator<llvm::StringRef>,_std::__detail::_Identity,_std::equal_to<llvm::StringRef>,_std::hash<llvm::StringRef>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_a0 + 0x18));
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ - local_a0._0_8_);
    }
    if (local_1c8 != (code *)0x0) {
      (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
    }
    if (local_1e8 != (code *)0x0) {
      (*local_1e8)(&local_1f8,&local_1f8,3);
    }
    std::
    _Hashtable<llvm::StringRef,_llvm::StringRef,_std::allocator<llvm::StringRef>,_std::__detail::_Identity,_std::equal_to<llvm::StringRef>,_std::hash<llvm::StringRef>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_168.keys._M_h);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_168.envStorage);
    if (local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_168.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
LAB_001c0c85:
  if (local_f0 != local_e0) {
    free(local_f0);
  }
  return;
}

Assistant:

virtual void executeProcess(
      QueueJobContext* opaqueContext,
      ArrayRef<StringRef> commandLine,
      ArrayRef<std::pair<StringRef, StringRef>> environment,
      ProcessAttributes attributes,
      llvm::Optional<ProcessCompletionFn> completionFn,
      ProcessDelegate* delegate
  ) override {

    LaneBasedExecutionQueueJobContext& context =
      *reinterpret_cast<LaneBasedExecutionQueueJobContext*>(opaqueContext);

    llvm::SmallString<64> description;
    context.job.getDescriptor()->getShortDescription(description);
    TracingExecutionQueueSubprocessStart(context.laneNumber, description.str());

    {
      std::unique_lock<std::mutex> lock(readyJobsMutex);
      // Do not execute new processes anymore after cancellation.
      if (cancelled) {
        if (completionFn.hasValue())
          completionFn.getValue()(ProcessResult::makeCancelled());
        return;
      }
    }

    // Form the complete environment.
    //
    // NOTE: We construct the environment in order of precedence, so
    // overridden keys should be defined first.
    POSIXEnvironment posixEnv;

    // Export lane ID to subprocesses.
    posixEnv.setIfMissing("LLBUILD_BUILD_ID", Twine(buildID).str());
    posixEnv.setIfMissing("LLBUILD_LANE_ID", Twine(context.laneNumber).str());

    // Add the requested environment.
    for (const auto& entry: environment) {
      posixEnv.setIfMissing(entry.first, entry.second);
    }

    // Inherit the base environment, if desired.
    //
    // FIXME: This involves a lot of redundant allocation, currently. We could
    // cache this for the common case of a directly inherited environment.
    if (attributes.inheritEnvironment) {
      for (const char* const* p = this->environment; *p != nullptr; ++p) {
        auto pair = StringRef(*p).split('=');
        posixEnv.setIfMissing(pair.first, pair.second);
      }
    }

    // Assign a process handle, which just needs to be unique for as long as we
    // are communicating with the delegate.
    ProcessHandle handle;
    handle.id = context.jobID;

    ProcessReleaseFn releaseFn = [this](std::function<void()>&& processWait) {
      auto previousTaskCount = backgroundTaskCount.fetch_add(1);
      if (previousTaskCount < backgroundTaskMax) {
        // Launch the process wait on a detached thread
        std::thread([this, processWait=std::move(processWait)]() mutable {
          processWait();
          backgroundTaskCount--;
        }).detach();
      } else {
        backgroundTaskCount--;
        // not allowed to release, call wait directly
        processWait();
      }
    };

    ProcessCompletionFn laneCompletionFn{
      [completionFn, lane=context.laneNumber](ProcessResult result) mutable {
        TracingExecutionQueueSubprocessResult(lane, result.pid, result.utime,
                                              result.stime, result.maxrss);
        if (completionFn.hasValue())
          completionFn.getValue()(result);
      }
    };

    spawnProcess(
        delegate ? *delegate : getDelegate(),
        reinterpret_cast<ProcessContext*>(context.job.getDescriptor()),
        spawnedProcesses,
        handle,
        commandLine,
        posixEnv,
        attributes,
        std::move(releaseFn),
        std::move(laneCompletionFn)
    );
  }